

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::getMember
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandedDecl *this,StringPtr memberName,Reader subSource)

{
  Resolver *resolver;
  bool bVar1;
  ResolvedDecl *pRVar2;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  *other;
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  *pOVar3;
  BrandScope *this_00;
  BrandedDecl local_1d0;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_108;
  undefined1 local_98 [8];
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  r;
  BrandedDecl *this_local;
  StringPtr memberName_local;
  
  r.field_1._96_8_ = this;
  bVar1 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(&this->body);
  if (bVar1) {
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
              (__return_storage_ptr__,(void *)0x0);
  }
  else {
    pRVar2 = kj::
             OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
             ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
    this_local._0_4_ = memberName.content.ptr._0_4_;
    this_local._4_4_ = memberName.content.ptr._4_4_;
    memberName_local.content.ptr._0_4_ = (undefined4)memberName.content.size_;
    memberName_local.content.ptr._4_4_ = memberName.content.size_._4_4_;
    local_118 = this_local._0_4_;
    uStack_114 = this_local._4_4_;
    uStack_110 = memberName_local.content.ptr._0_4_;
    uStack_10c = memberName_local.content.ptr._4_4_;
    (*pRVar2->resolver->_vptr_Resolver[1])
              (&local_108,pRVar2->resolver,memberName.content.ptr,memberName.content.size_);
    other = kj::_::
            readMaybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>>
                      (&local_108);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)local_98,other);
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_108);
    pOVar3 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_98);
    if (pOVar3 == (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                   *)0x0) {
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,(void *)0x0);
    }
    else {
      this_00 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->(&this->brand);
      pRVar2 = kj::
               OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
               ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
      resolver = pRVar2->resolver;
      pOVar3 = kj::_::
               NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
               ::operator*((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                            *)local_98);
      BrandScope::interpretResolve(&local_1d0,this_00,resolver,pOVar3,subSource);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,&local_1d0);
      ~BrandedDecl(&local_1d0);
    }
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                      *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandedDecl::getMember(
    kj::StringPtr memberName, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return nullptr;
  } else KJ_IF_MAYBE(r, body.get<Resolver::ResolvedDecl>().resolver->resolveMember(memberName)) {
    return brand->interpretResolve(*body.get<Resolver::ResolvedDecl>().resolver, *r, subSource);
  } else {
    return nullptr;
  }
}